

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O3

int mk_buffer_cat(mk_ptr_t *p,char *buf1,int len1,char *buf2,int len2)

{
  unsigned_long uVar1;
  char *__dest;
  ulong __n;
  
  if (-1 < (len2 | len1)) {
    __n = (ulong)(uint)len1;
    uVar1 = (uint)len2 + __n;
    __dest = (char *)malloc((ulong)((int)uVar1 + 1));
    if (__dest == (char *)0x0) {
      perror("malloc");
    }
    p->data = __dest;
    memcpy(__dest,buf1,__n);
    memcpy(__dest + __n,buf2,(ulong)(uint)len2);
    __dest[uVar1] = '\0';
    p->len = uVar1;
    return 0;
  }
  return -1;
}

Assistant:

int mk_buffer_cat(mk_ptr_t *p, char *buf1, int len1, char *buf2, int len2)
{
    /* Validate lengths */
    if (mk_unlikely(len1 < 0 || len2 < 0)) {
         return -1;
    }

    /* alloc space */
    p->data = (char *) mk_mem_alloc(len1 + len2 + 1);

    /* copy data */
    memcpy(p->data, buf1, len1);
    memcpy(p->data + len1, buf2, len2);
    p->data[len1 + len2] = '\0';

    /* assign len */
    p->len = len1 + len2;

    return 0;
}